

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall spvtools::opt::MergeReturnPass::AddNewPhiNodes(MergeReturnPass *this,BasicBlock *bb)

{
  IRContext *this_00;
  Instruction *inst_00;
  DominatorTree *this_01;
  BasicBlock *pBVar1;
  mapped_type *ppIVar2;
  BasicBlock *A;
  BasicBlock *__range3;
  Instruction *inst;
  BasicBlock *local_38;
  
  local_38 = bb;
  this_01 = (DominatorTree *)
            IRContext::GetDominatorAnalysis
                      ((this->super_MemPass).super_Pass.context_,this->function_);
  pBVar1 = DominatorAnalysisBase::ImmediateDominator((DominatorAnalysisBase *)this_01,bb);
  if (pBVar1 != (BasicBlock *)0x0) {
    this_00 = (this->super_MemPass).super_Pass.context_;
    ppIVar2 = std::__detail::
              _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->original_dominator_,&local_38);
    for (A = IRContext::get_instr_block(this_00,*ppIVar2); (A != (BasicBlock *)0x0 && (A != pBVar1))
        ; A = DominatorTree::ImmediateDominator(this_01,A)) {
      inst_00 = &(A->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
      while (inst_00 = *(Instruction **)
                        ((long)&inst_00->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
            inst_00 != &(A->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
        CreatePhiNodesForInst(this,local_38,inst_00);
      }
    }
  }
  return;
}

Assistant:

void MergeReturnPass::AddNewPhiNodes(BasicBlock* bb) {
  // New phi nodes are needed for any id whose definition used to dominate |bb|,
  // but no longer dominates |bb|.  These are found by walking the dominator
  // tree starting at the original immediate dominator of |bb| and ending at its
  // current dominator.

  // Because we are walking the updated dominator tree it is important that the
  // new phi nodes for the original dominators of |bb| have already been added.
  // Otherwise some ids might be missed.  Consider the case where bb1 dominates
  // bb2, and bb2 dominates bb3.  Suppose there are changes such that bb1 no
  // longer dominates bb2 and the same for bb2 and bb3.  This algorithm will not
  // look at the ids defined in bb1.  However, calling |AddNewPhiNodes(bb2)|
  // first will add a phi node in bb2 for that value.  Then a call to
  // |AddNewPhiNodes(bb3)| will process that value by processing the phi in bb2.
  DominatorAnalysis* dom_tree = context()->GetDominatorAnalysis(function_);

  BasicBlock* dominator = dom_tree->ImmediateDominator(bb);
  if (dominator == nullptr) {
    return;
  }

  BasicBlock* current_bb = context()->get_instr_block(original_dominator_[bb]);
  while (current_bb != nullptr && current_bb != dominator) {
    for (Instruction& inst : *current_bb) {
      CreatePhiNodesForInst(bb, inst);
    }
    current_bb = dom_tree->ImmediateDominator(current_bb);
  }
}